

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::MakeDefaultFieldName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  AlphaNum *in_R8;
  string local_148;
  string local_128;
  undefined8 local_108;
  char *local_100;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  undefined8 local_48;
  char *local_40;
  
  local_108 = 7;
  local_100 = "Impl_::";
  local_48 = 0x2e;
  local_40 = "_i_give_permission_to_break_this_code_default_";
  FieldName_abi_cxx11_(&local_128,this,field);
  local_78.piece_._M_len = local_128._M_string_length;
  local_78.piece_._M_str = local_128._M_dataplus._M_p;
  local_a8.piece_._M_len = 1;
  local_a8.piece_._M_str = "_";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_148,(lts_20250127 *)&local_48,&local_78,&local_a8,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_d8.piece_._M_len = local_148._M_string_length;
  local_d8.piece_._M_str = local_148._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_108,&local_d8,
             (AlphaNum *)local_148._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string MakeDefaultFieldName(const FieldDescriptor* field) {
  return absl::StrCat("Impl_::", MakeDefaultName(field));
}